

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

size_t clip_image_f32_batch_ny(clip_image_f32_batch *batch,int idx)

{
  size_type sVar1;
  pointer pcVar2;
  uint in_ESI;
  vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  *in_RDI;
  
  if ((-1 < (int)in_ESI) &&
     (sVar1 = std::
              vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
              ::size(in_RDI), (int)in_ESI < (int)sVar1)) {
    std::
    vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
    ::operator[](in_RDI,(long)(int)in_ESI);
    pcVar2 = std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>::operator->
                       ((unique_ptr<clip_image_f32,_clip_image_f32_deleter> *)0x1961b3);
    return (long)pcVar2->ny;
  }
  if ((int)g_logger_state.verbosity_thold < 5) {
    clip_log_internal(GGML_LOG_LEVEL_ERROR,"%s: invalid index %d\n","clip_image_f32_batch_ny",
                      (ulong)in_ESI);
  }
  return 0;
}

Assistant:

size_t clip_image_f32_batch_ny(const struct clip_image_f32_batch * batch, int idx) {
    if (idx < 0 || idx >= (int)batch->entries.size()) {
        LOG_ERR("%s: invalid index %d\n", __func__, idx);
        return 0;
    }
    return batch->entries[idx]->ny;
}